

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SmallVector<spirv_cross::BufferRange,_8UL> * __thiscall
spirv_cross::Compiler::get_active_buffer_ranges
          (SmallVector<spirv_cross::BufferRange,_8UL> *__return_storage_ptr__,Compiler *this,
          VariableID id)

{
  uint32_t uVar1;
  SPIRFunction *func;
  undefined1 local_80 [8];
  BufferAccessHandler handler;
  Compiler *this_local;
  SmallVector<spirv_cross::BufferRange,_8UL> *pSStack_10;
  VariableID id_local;
  SmallVector<spirv_cross::BufferRange,_8UL> *ranges;
  
  handler.seen._M_h._M_single_bucket._7_1_ = 0;
  this_local._4_4_ = id.id;
  pSStack_10 = __return_storage_ptr__;
  SmallVector<spirv_cross::BufferRange,_8UL>::SmallVector(__return_storage_ptr__);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  BufferAccessHandler::BufferAccessHandler
            ((BufferAccessHandler *)local_80,this,__return_storage_ptr__,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<spirv_cross::SPIRFunction>(this,uVar1);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_80);
  handler.seen._M_h._M_single_bucket._7_1_ = 1;
  BufferAccessHandler::~BufferAccessHandler((BufferAccessHandler *)local_80);
  if ((handler.seen._M_h._M_single_bucket._7_1_ & 1) == 0) {
    SmallVector<spirv_cross::BufferRange,_8UL>::~SmallVector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<BufferRange> Compiler::get_active_buffer_ranges(VariableID id) const
{
	SmallVector<BufferRange> ranges;
	BufferAccessHandler handler(*this, ranges, id);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	return ranges;
}